

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall CMU462::AppConfig::AppConfig(AppConfig *this)

{
  undefined8 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 8));
  *in_RDI = 1;
  in_RDI[1] = 1;
  in_RDI[2] = 4;
  in_RDI[3] = 1;
  in_RDI[4] = 1;
  in_RDI[5] = 1;
  in_RDI[6] = 1;
  in_RDI[7] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 8),"");
  return;
}

Assistant:

AppConfig() {
    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 4;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;
    pathtracer_result_path = "";
  }